

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPerfCounter.c
# Opt level: O2

uint64_t sbfPerfCounter_frequency(void)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *line;
  unsigned_long_long n;
  size_t size;
  char *local_40;
  uint64_t local_38;
  size_t local_30;
  
  if ((sbfPerfCounter_frequency_processed == '\0') &&
     (__stream = fopen("/proc/cpuinfo","r"), __stream != (FILE *)0x0)) {
    local_40 = (char *)0x0;
    do {
      _Var2 = getline(&local_40,&local_30,__stream);
      if (_Var2 == -1) goto LAB_0010731e;
      iVar1 = __isoc99_sscanf(local_40,"cpu MHz         : %llu.",&local_38);
    } while (iVar1 != 1);
    sbfPerfCounter_frequency::frequency = local_38;
LAB_0010731e:
    free(local_40);
    fclose(__stream);
    sbfPerfCounter_frequency_processed = '\x01';
  }
  return sbfPerfCounter_frequency::frequency;
}

Assistant:

uint64_t
sbfPerfCounter_frequency (void)
{
    static uint64_t    frequency;
    static int         processed = 0;
    FILE*              f;
    char*              line;
    size_t             size;
    unsigned long long n;

    // Get the frequence and cache it
    if (processed == 0)
    {
        f = fopen ("/proc/cpuinfo", "r");
        // Not supported method to collect CPU Frequency
        if (f == NULL)
            return frequency;

        // Collect CPU frequency looking for cpu MHz line
        line = NULL;
        while (getline (&line, &size, f) != -1)
        {
            if (sscanf (line, "cpu MHz         : %llu.", &n) == 1)
            {
                frequency = n;
                break;
            }
        }

        free (line);
        fclose (f);

        processed = 1;
    }

    return frequency;
}